

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O0

ChArchiveIn * __thiscall
chrono::ChArchiveIn::operator>>
          (ChArchiveIn *this,
          ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
          *bVal)

{
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  local_30;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  *local_18;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  *bVal_local;
  ChArchiveIn *this_local;
  
  local_18 = bVal;
  bVal_local = (ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
                *)this;
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  ::ChNameValue(&local_30,bVal);
  in<chrono::ChVector<double>>(this,&local_30);
  ChNameValue<std::__cxx11::list<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>_>
  ::~ChNameValue(&local_30);
  return this;
}

Assistant:

ChArchiveIn& operator>>(ChNameValue<T> bVal) {
          this->in(bVal);
          return (*this);
      }